

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_hdr_t * sam_hdr_parse(int l_text,char *text)

{
  char *__src;
  char cVar1;
  uint uVar2;
  khint32_t *pkVar3;
  int64_t *piVar4;
  long lVar5;
  khint_t kVar6;
  kh_s2i_t *h;
  char *pcVar7;
  bam_hdr_t *pbVar8;
  uint32_t *puVar9;
  char **ppcVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  size_t __n;
  int absent;
  char *local_40;
  int local_34;
  
  h = kh_init_s2i();
  while (*text != '\0') {
    if (((*text == '@') && (text[1] == 'S')) && (text[2] == 'Q')) {
      local_40 = text + 4;
      uVar11 = 0xffffffff;
      pcVar7 = (kh_cstr_t)0x0;
      do {
        if (*local_40 == 'L') {
          if ((local_40[1] == 'N') && (local_40[2] == ':')) {
            uVar11 = strtol(local_40 + 3,&local_40,10);
          }
        }
        else if (((*local_40 == 'S') && (local_40[1] == 'N')) && (local_40[2] == ':')) {
          __src = local_40 + 3;
          pcVar14 = local_40 + 2;
          __n = 0xffffffffffffffff;
          do {
            sVar15 = __n;
            pcVar7 = pcVar14 + 1;
            pcVar14 = pcVar14 + 1;
            __n = sVar15 + 1;
          } while (1 < (byte)(*pcVar7 - 9U));
          local_40 = __src;
          pcVar7 = (char *)calloc(sVar15 + 2,1);
          strncpy(pcVar7,__src,__n);
          local_40 = pcVar14;
        }
        do {
          text = local_40;
          local_40 = text + 1;
        } while (1 < (byte)(*text - 9U));
      } while (*text != '\n');
      local_40 = text;
      if ((pcVar7 != (kh_cstr_t)0x0) && (-1 < (int)uVar11)) {
        kVar6 = kh_put_s2i(h,pcVar7,&local_34);
        if (local_34 == 0) {
          if (1 < hts_verbose) {
            fprintf(_stderr,"[W::%s] duplicated sequence \'%s\'\n","sam_hdr_parse",pcVar7);
          }
          free(pcVar7);
        }
        else {
          h->vals[kVar6] = uVar11 & 0xffffffff | (ulong)(h->size - 1) << 0x20;
        }
      }
    }
    do {
      cVar1 = *text;
      text = text + 1;
    } while (cVar1 != '\n');
  }
  pbVar8 = (bam_hdr_t *)calloc(1,0x38);
  pbVar8->sdict = h;
  kVar6 = h->size;
  pbVar8->n_targets = kVar6;
  puVar9 = (uint32_t *)malloc((long)(int)kVar6 * 4);
  pbVar8->target_len = puVar9;
  ppcVar10 = (char **)malloc((long)(int)kVar6 << 3);
  pbVar8->target_name = ppcVar10;
  uVar2 = h->n_buckets;
  if ((ulong)uVar2 != 0) {
    pkVar3 = h->flags;
    bVar12 = 0;
    uVar11 = 0;
    do {
      if ((pkVar3[uVar11 >> 4 & 0xfffffff] >> (bVar12 & 0x1e) & 3) == 0) {
        piVar4 = h->vals;
        lVar5 = piVar4[uVar11];
        lVar13 = lVar5 >> 0x20;
        ppcVar10[lVar13] = h->keys[uVar11];
        puVar9[lVar13] = (uint32_t)lVar5;
        piVar4[uVar11] = lVar13;
      }
      uVar11 = uVar11 + 1;
      bVar12 = bVar12 + 2;
    } while (uVar2 != uVar11);
  }
  return pbVar8;
}

Assistant:

bam_hdr_t *sam_hdr_parse(int l_text, const char *text)
{
    const char *q, *r, *p;
    khash_t(s2i) *d;
    d = kh_init(s2i);
    for (p = text; *p; ++p) {
        if (strncmp(p, "@SQ", 3) == 0) {
            char *sn = 0;
            int ln = -1;
            for (q = p + 4;; ++q) {
                if (strncmp(q, "SN:", 3) == 0) {
                    q += 3;
                    for (r = q; *r != '\t' && *r != '\n'; ++r);
                    sn = (char*)calloc(r - q + 1, 1);
                    strncpy(sn, q, r - q);
                    q = r;
                } else if (strncmp(q, "LN:", 3) == 0)
                    ln = strtol(q + 3, (char**)&q, 10);
                while (*q != '\t' && *q != '\n') ++q;
                if (*q == '\n') break;
            }
            p = q;
            if (sn && ln >= 0) {
                khint_t k;
                int absent;
                k = kh_put(s2i, d, sn, &absent);
                if (!absent) {
                    if (hts_verbose >= 2)
                        fprintf(stderr, "[W::%s] duplicated sequence '%s'\n", __func__, sn);
                    free(sn);
                } else kh_val(d, k) = (int64_t)(kh_size(d) - 1)<<32 | ln;
            }
        }
        while (*p != '\n') ++p;
    }
    return hdr_from_dict(d);
}